

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

void VW_Set_Weight(VW_HANDLE handle,size_t index,size_t offset,float value)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var1;
  long lVar2;
  byte *pbVar3;
  uint64_t index_1;
  ulong local_38;
  ulong local_30;
  float *local_28;
  
  pbVar3 = (byte *)((long)handle + 0x35a8);
  if (*(char *)((long)handle + 0x3590) != '\0') {
    pbVar3 = (byte *)((long)handle + 0x35f0);
  }
  local_38 = (index & 0xffffffff) << (*pbVar3 & 0x3f);
  if (*(char *)((long)handle + 0x3590) == '\x01') {
    this = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)((long)handle + 0x35b0);
    local_38 = local_38 & *(ulong *)((long)handle + 0x35e8);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(this,&local_38);
    if (_Var1._M_cur == (__node_type *)0x0) {
      local_28 = calloc_or_throw<float>(1L << (*(byte *)((long)handle + 0x35f0) & 0x3f));
      local_30 = local_38;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long,float*>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this);
      _Var1._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(this,&local_38);
      if (*(code **)((long)handle + 0x3608) != (code *)0x0) {
        (**(code **)((long)handle + 0x3608))
                  (*(undefined8 *)((long)_Var1._M_cur + 0x10),*(undefined8 *)((long)handle + 0x35f8)
                  );
      }
    }
    lVar2 = *(long *)((long)&((_Var1._M_cur)->
                             super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>)
                             .super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                             _M_storage._M_storage + 8);
  }
  else {
    lVar2 = (local_38 & *(ulong *)((long)handle + 0x35a0)) * 4 + *(long *)((long)handle + 0x3598);
  }
  *(float *)(lVar2 + (offset & 0xffffffff) * 4) = value;
  return;
}

Assistant:

VW_DLL_MEMBER void VW_CALLING_CONV VW_Set_Weight(VW_HANDLE handle, size_t index, size_t offset, float value)
{ vw* pointer = static_cast<vw*>(handle);
  return VW::set_weight(*pointer, (uint32_t) index, (uint32_t)offset, value);
}